

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O1

string * __thiscall
VideoHppGenerator::generateStructMembers
          (string *__return_storage_ptr__,VideoHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
          *structData)

{
  pointer pMVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  undefined1 *puVar4;
  size_type __n;
  bool bVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  const_iterator cVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sizes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string type;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
  *local_40;
  pointer local_38;
  
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar1 = (structData->second).members.
           super__Vector_base<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (structData->second).members.
             super__Vector_base<VideoHppGenerator::MemberData,_std::allocator<VideoHppGenerator::MemberData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar1 != local_38) {
    local_40 = &this->m_enums;
    local_48 = &(this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header;
    sizes = &pMVar1->arraySizes;
    local_78 = __return_storage_ptr__;
    do {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"    ");
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      if (((string *)(sizes + 1))->_M_string_length == 0) {
LAB_0010c05d:
        if ((sizes->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start ==
            (sizes->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE","");
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"StdVideo","");
          TypeInfo::compose(&local_d8,(TypeInfo *)((long)(sizes + -6) + 0x10),&local_f8,&local_b8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_70,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          __return_storage_ptr__ = local_78;
          uVar10 = local_f8.field_2._M_allocated_capacity;
          _Var11._M_p = local_f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_0010c299:
            operator_delete(_Var11._M_p,uVar10 + 1);
          }
        }
        else {
          if ((*(size_type *)(sizes + -5) != 0) || (*(long *)((long)(sizes + -3) + 0x10) != 0)) {
            __assert_fail("member.type.prefix.empty() && member.type.postfix.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                          ,0x163,
                          "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                         );
          }
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE","");
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Vk","");
          TypeInfo::compose(&local_f8,(TypeInfo *)((long)(sizes + -6) + 0x10),&local_b8,&local_98);
          generateStandardArrayWrapper(&local_d8,&local_f8,sizes);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_70,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          uVar10 = local_b8.field_2._M_allocated_capacity;
          _Var11._M_p = local_b8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_0010c299;
        }
      }
      else {
        local_d8._M_string_length = (size_type)(((string *)(sizes + -4))->_M_dataplus)._M_p;
        local_d8._M_dataplus._M_p = (pointer)((string *)(sizes + -4))->_M_string_length;
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_d8,"StdVideo")
        ;
        if (!bVar5) goto LAB_0010c05d;
        if ((*(size_type *)(sizes + -5) != 0) || (*(long *)((long)(sizes + -3) + 0x10) != 0)) {
          __assert_fail("member.type.prefix.empty() && member.type.postfix.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                        ,0x15a,
                        "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                       );
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sizes + -4)
                  );
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_f8," ");
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_f8,
                         (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(sizes + -2))[1]._M_allocated_capacity,
                         *(size_type *)(sizes + -1));
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar7->_M_dataplus)._M_p;
      paVar9 = &pbVar7->field_2;
      if (paVar2 == paVar9) {
        local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_d8._M_dataplus._M_p = (pointer)paVar2;
      }
      local_d8._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (((sizes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start !=
           (sizes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish) &&
         (((string *)(sizes + 1))->_M_string_length != 0)) {
        __assert_fail("member.arraySizes.empty() || member.bitCount.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                      ,0x169,
                      "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                     );
      }
      if (((string *)(sizes + 1))->_M_string_length == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__," = ");
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
                ::find(&local_40->_M_t,(key_type *)(sizes + -4));
        if ((cVar8._M_node != local_48 &&
             (sizes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start ==
             (sizes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) &&
           (*(long *)((long)(sizes + -3) + 0x10) == 0)) {
          if ((*(size_type *)(sizes + -5) != 0) ||
             (*(_Base_ptr *)(cVar8._M_node + 2) == cVar8._M_node[2]._M_parent)) {
            __assert_fail("member.type.prefix.empty() && member.arraySizes.empty() && !enumIt->second.values.empty()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                          ,0x175,
                          "std::string VideoHppGenerator::generateStructMembers(const std::pair<std::string, StructureData> &) const"
                         );
          }
          toUpperCase(&local_f8,(key_type *)(sizes + -4));
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_f8,"_");
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if (paVar2 == paVar9) {
            local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          }
          else {
            local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_d8._M_dataplus._M_p = (pointer)paVar2;
          }
          local_d8._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          lVar3 = *(long *)(*(long *)(cVar8._M_node + 2) + 0x18);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,lVar3,
                     *(long *)(*(long *)(cVar8._M_node + 2) + 0x20) + lVar3);
          __n = local_d8._M_string_length;
          if ((local_d8._M_string_length <= local_98._M_string_length) &&
             (((pointer)local_d8._M_string_length == (pointer)0x0 ||
              (iVar6 = bcmp(local_98._M_dataplus._M_p,local_d8._M_dataplus._M_p,
                            local_d8._M_string_length), iVar6 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_98,0,__n);
          }
          toCamelCase(&local_b8,&local_98,true);
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_b8,0,0,"e",1);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if (paVar2 == paVar9) {
            local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          }
          else {
            local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_f8._M_dataplus._M_p = (pointer)paVar2;
          }
          local_f8._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,local_70._M_dataplus._M_p,
                     local_70._M_dataplus._M_p + local_70._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_98,"::");
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_98,local_f8._M_dataplus._M_p,local_f8._M_string_length);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if (paVar2 == paVar9) {
            local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          }
          else {
            local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_b8._M_dataplus._M_p = (pointer)paVar2;
          }
          local_b8._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_b8._M_dataplus._M_p,local_b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0010bf91;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"{}");
      }
      else {
        std::operator+(&local_d8," : ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (sizes + 1));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_d8._M_dataplus._M_p,local_d8._M_string_length);
LAB_0010bf91:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,";\n");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      puVar4 = (undefined1 *)(sizes + 2);
      sizes = sizes + 8;
    } while ((pointer)(puVar4 + 0x10) != local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VideoHppGenerator::generateStructMembers( std::pair<std::string, StructureData> const & structData ) const
{
  std::string members;
  for ( auto const & member : structData.second.members )
  {
    members += "    ";
    std::string type;
    if ( !member.bitCount.empty() && member.type.type.starts_with( "StdVideo" ) )
    {
      assert( member.type.prefix.empty() && member.type.postfix.empty() );  // never encounterd a different case
      type = member.type.type;
    }
    else if ( member.arraySizes.empty() )
    {
      type = member.type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE", "StdVideo" );
    }
    else
    {
      assert( member.type.prefix.empty() && member.type.postfix.empty() );
      type = generateStandardArrayWrapper( member.type.compose( "VULKAN_HPP_NAMESPACE::VULKAN_HPP_VIDEO_NAMESPACE" ), member.arraySizes );
    }
    members += type + " " + member.name;

    // as we don't have any meaningful default initialization values, everything can be initialized by just '{}' !
    assert( member.arraySizes.empty() || member.bitCount.empty() );
    if ( !member.bitCount.empty() )
    {
      members += " : " + member.bitCount;  // except for bitfield members, where no default member initialization
                                           // is supported (up to C++20)
    }
    else
    {
      members += " = ";
      auto enumIt = m_enums.find( member.type.type );
      if ( member.arraySizes.empty() && ( enumIt != m_enums.end() ) && member.type.postfix.empty() )
      {
        assert( member.type.prefix.empty() && member.arraySizes.empty() && !enumIt->second.values.empty() );

        std::string prefix    = toUpperCase( member.type.type ) + "_";
        std::string valueName = "e" + toCamelCase( stripPrefix( enumIt->second.values.front().name, prefix ), true );

        members += type + "::" + valueName;
      }
      else
      {
        members += "{}";
      }
    }
    members += ";\n";
  }
  return members;
}